

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O1

void __thiscall
presolve::HighsPostsolveStack::forcingColumnRemovedRow<HighsTripletTreeSlicePreOrder>
          (HighsPostsolveStack *this,HighsInt forcingCol,HighsInt row,double rhs,
          HighsMatrixSlice<HighsTripletTreeSlicePreOrder> *rowVec)

{
  int iVar1;
  pointer pNVar2;
  pointer pcVar3;
  pointer pcVar4;
  pointer pcVar5;
  iterator __begin0;
  double local_80;
  double local_78;
  iterator local_70;
  
  pNVar2 = (this->rowValues).
           super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->rowValues).
      super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
      ._M_impl.super__Vector_impl_data._M_finish != pNVar2) {
    (this->rowValues).
    super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
    ._M_impl.super__Vector_impl_data._M_finish = pNVar2;
  }
  local_78 = rhs;
  HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::begin(&local_70,rowVec);
  while (local_70.currentNode != -1) {
    if (*local_70.pos_.index_ != forcingCol) {
      local_80 = *local_70.pos_.value_;
      std::
      vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
      ::emplace_back<int&,double>
                ((vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
                  *)&this->rowValues,
                 (this->origColIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + *local_70.pos_.index_,&local_80);
    }
    HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::operator++(&local_70);
  }
  if (local_70.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  pcVar3 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar1 = (this->origRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[row];
  pcVar4 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<char,_std::allocator<char>_>::resize
            (&(this->reductionValues).data,(size_type)(pcVar3 + (0x10 - (long)pcVar4)));
  pcVar5 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  *(double *)(pcVar3 + ((long)pcVar5 - (long)pcVar4)) = local_78;
  *(int *)(pcVar3 + (long)(pcVar5 + (8 - (long)pcVar4))) = iVar1;
  HighsDataStack::push<presolve::HighsPostsolveStack::Nonzero>
            (&this->reductionValues,&this->rowValues);
  local_80 = (double)CONCAT71(local_80._1_7_,10);
  local_70.pos_.index_ =
       (HighsInt *)
       ((this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish +
       -(long)(this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start);
  std::
  vector<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>,std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>>>
  ::emplace_back<presolve::HighsPostsolveStack::ReductionType&,unsigned_long&>
            ((vector<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>,std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>>>
              *)&this->reductions,(ReductionType *)&local_80,(unsigned_long *)&local_70);
  return;
}

Assistant:

void forcingColumnRemovedRow(
      HighsInt forcingCol, HighsInt row, double rhs,
      const HighsMatrixSlice<RowStorageFormat>& rowVec) {
    rowValues.clear();
    for (const HighsSliceNonzero& rowVal : rowVec)
      if (rowVal.index() != forcingCol)
        rowValues.emplace_back(origColIndex[rowVal.index()], rowVal.value());

    reductionValues.push(ForcingColumnRemovedRow{rhs, origRowIndex[row]});
    reductionValues.push(rowValues);
    reductionAdded(ReductionType::kForcingColumnRemovedRow);
  }